

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# privparent.c
# Opt level: O1

void privop_pasv_active(session_t *sess)

{
  priv_sock_send_int(sess->parent_fd,(uint)(sess->pasv_listen_fd != -1));
  return;
}

Assistant:

void privop_pasv_active(session_t *sess) {
  int active;
  if (sess->pasv_listen_fd != -1) {
    active = 1;
  } else {
    active = 0;
  }
  priv_sock_send_int(sess->parent_fd, active);
}